

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O0

UnknownFieldSet * __thiscall
google::protobuf::internal::
InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
::mutable_unknown_fields_slow
          (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           *this)

{
  Container *pCVar1;
  ArenaImpl *in_RDI;
  Container *container;
  Arena *my_arena;
  size_t n;
  size_t in_stack_ffffffffffffff30;
  Arena *allocated_type;
  Arena *in_stack_ffffffffffffff40;
  ArenaImpl *pAVar2;
  Arena *local_88;
  __pointer_type local_40;
  
  pAVar2 = in_RDI;
  if (((uint)(in_RDI->threads_)._M_b._M_p & 1) == 1) {
    pCVar1 = InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
             ::
             PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                       ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                         *)in_RDI);
    local_88 = pCVar1->arena;
  }
  else {
    local_88 = PtrValue<google::protobuf::Arena>
                         ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                           *)in_RDI);
  }
  if (local_88 == (Arena *)0x0) {
    local_40 = (__pointer_type)operator_new(0x20);
    local_40->head_ = (Block *)0x0;
    local_40->cleanup_ = (CleanupChunk *)0x0;
    (((vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
     &local_40->arena_)->
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_40->owner_ = (pointer)0x0;
    Container::Container((Container *)0x1abd8d);
  }
  else {
    allocated_type = local_88;
    AlignUpTo8(0x20);
    Arena::AllocHook(in_stack_ffffffffffffff40,(type_info *)allocated_type,in_stack_ffffffffffffff30
                    );
    local_40 = (__pointer_type)
               ArenaImpl::AllocateAlignedAndAddCleanup
                         (pAVar2,(size_t)in_RDI,(_func_void_void_ptr *)in_stack_ffffffffffffff40);
    memset(local_40,0,0x20);
    Container::Container((Container *)0x1abeab);
  }
  (in_RDI->threads_)._M_b._M_p = local_40;
  (in_RDI->threads_)._M_b._M_p = (__pointer_type)((ulong)(in_RDI->threads_)._M_b._M_p | 1);
  local_40->cleanup_ = (CleanupChunk *)local_88;
  return (UnknownFieldSet *)local_40;
}

Assistant:

PROTOBUF_NOINLINE T* mutable_unknown_fields_slow() {
    Arena* my_arena = arena();
    Container* container = Arena::Create<Container>(my_arena);
    // Two-step assignment works around a bug in clang's static analyzer:
    // https://bugs.llvm.org/show_bug.cgi?id=34198.
    ptr_ = container;
    ptr_ = reinterpret_cast<void*>(reinterpret_cast<intptr_t>(ptr_) |
                                   kTagContainer);
    container->arena = my_arena;
    return &(container->unknown_fields);
  }